

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,ProStringList>::emplace<ProStringList_const&>
          (QHash<QString,_ProStringList> *this,QString *key,ProStringList *args)

{
  long lVar1;
  QString *in_RDX;
  QHash<QString,_ProStringList> *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  piter pVar2;
  QString copy;
  QString *in_stack_ffffffffffffff88;
  ProStringList *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_RDI,in_stack_ffffffffffffff88);
  pVar2 = (piter)emplace<ProStringList_const&>(in_RSI,in_RDX,in_stack_ffffffffffffffa8);
  QString::~QString((QString *)0x29e6e6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }